

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

int CountTotalFuncs(Lexer *lexer)

{
  Token TVar1;
  int total;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    TVar1 = GetNextToken(lexer);
    if (TVar1 == UNDEFINED) break;
    if (TVar1 == FUNC) {
      iVar2 = iVar2 + 1;
    }
  }
  if (lexer->currentTokenString != (char *)0x0) {
    Free(lexer->currentTokenString);
  }
  return iVar2;
}

Assistant:

int CountTotalFuncs(Lexer* lexer){	
	int total = 0;
	Token tok = GetNextToken(lexer);

	while (tok != UNDEFINED){
		if (tok == FUNC) total++;
		tok = GetNextToken(lexer);
	}
	DestroyLexer(lexer);
	return total;
}